

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall QRasterPaintEngine::fillRect(QRasterPaintEngine *this,QRectF *r,QSpanData *data)

{
  QTransform *this_00;
  QPaintEngineState *pQVar1;
  QRasterPaintEnginePrivate *this_01;
  double dVar2;
  TransformationType TVar3;
  QTransform *this_02;
  QRect *r_00;
  QRectF *this_03;
  QPaintEngineState *pQVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  QPointF QVar6;
  QPainterPath path;
  QPointF local_88;
  QPointF local_78;
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  this_01 = (QRasterPaintEnginePrivate *)(this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  pQVar4 = pQVar1 + -2;
  if (pQVar1 == (QPaintEngineState *)0x0) {
    pQVar4 = (QPaintEngineState *)0x0;
  }
  if ((pQVar4[0x105].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
       super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 8) == 0) {
    this_00 = (QTransform *)(pQVar4 + 0x36);
    this_02 = this_00;
    TVar3 = QTransform::type(this_00);
    if (TVar3 == TxScale) {
      r_00 = (QRect *)local_48;
      stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      this_03 = (QRectF *)local_68;
      QTransform::mapRect((QRectF *)local_68,this_00,r);
      _local_48 = toNormalizedFillRect((QRasterPaintEngine *)this_03,(QRectF *)local_68);
    }
    else {
      if (TVar3 == TxTranslate) {
        dVar2 = r->yp + *(double *)(pQVar4 + 0x44);
        local_68._8_4_ = SUB84(dVar2,0);
        local_68._0_8_ = r->xp + *(double *)(pQVar4 + 0x42);
        local_68._12_4_ = (int)((ulong)dVar2 >> 0x20);
        local_58 = r->w;
        dStack_50 = r->h;
        QVar5 = toNormalizedFillRect((QRasterPaintEngine *)this_02,(QRectF *)local_68);
        r_00 = (QRect *)local_48;
      }
      else {
        if (TVar3 != TxNone) goto LAB_003726d1;
        QVar5 = toNormalizedFillRect((QRasterPaintEngine *)this_02,r);
        r_00 = (QRect *)local_68;
      }
      *r_00 = QVar5;
    }
    fillRect_normalized(r_00,data,this_01);
  }
  else {
LAB_003726d1:
    ensureRasterState(this);
    if ((pQVar4[0x105].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
         super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 0x40) == 0) {
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPainterPath::QPainterPath((QPainterPath *)local_68);
      QPainterPath::addRect((QPainterPath *)local_68,r);
      ensureOutlineMapper(this);
      (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x36])
                (this,(QPainterPath *)local_68,data);
      QPainterPath::~QPainterPath((QPainterPath *)local_68);
    }
    else {
      QRasterPaintEnginePrivate::initializeRasterizer(this_01,data);
      local_58 = -NAN;
      dStack_50 = -NAN;
      local_68._8_4_ = 0xffffffff;
      local_68._0_8_ = 0xffffffffffffffff;
      local_68._12_4_ = -1;
      QRectF::normalized();
      if ((0.0 < local_58) && (0.0 < dStack_50)) {
        local_48._8_4_ = 0xffffffff;
        local_48._0_4_ = -1;
        local_48._4_4_ = -1;
        RStack_3c.m_i = -1;
        local_78.xp = ((double)local_68._0_8_ + (double)local_68._0_8_) * 0.5;
        local_78.yp = (dStack_50 + (double)local_68._8_8_ + (double)local_68._8_8_) * 0.5;
        _local_48 = (QRect)QTransform::map((QTransform *)(pQVar4 + 0x36),&local_78);
        local_78.xp = -NAN;
        local_78.yp = -NAN;
        local_88.xp = ((double)local_68._0_8_ + local_58 + (double)local_68._0_8_ + local_58) * 0.5;
        local_88.yp = ((double)local_68._8_8_ + (double)local_68._8_8_ + dStack_50) * 0.5;
        QVar6 = QTransform::map((QTransform *)(pQVar4 + 0x36),&local_88);
        local_78.xp = QVar6.xp;
        local_78.yp = QVar6.yp;
        QRasterizer::rasterizeLine
                  ((this_01->rasterizer).d,(QPointF *)local_48,&local_78,dStack_50 / local_58,false)
        ;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::fillRect(const QRectF &r, QSpanData *data)
{
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();

    if (!s->flags.antialiased) {
        uint txop = s->matrix.type();
        if (txop == QTransform::TxNone) {
            fillRect_normalized(toNormalizedFillRect(r), data, d);
            return;
        } else if (txop == QTransform::TxTranslate) {
            const QRect rr = toNormalizedFillRect(r.translated(s->matrix.dx(), s->matrix.dy()));
            fillRect_normalized(rr, data, d);
            return;
        } else if (txop == QTransform::TxScale) {
            const QRect rr = toNormalizedFillRect(s->matrix.mapRect(r));
            fillRect_normalized(rr, data, d);
            return;
        }
    }
    ensureRasterState();
    if (s->flags.tx_noshear) {
        d->initializeRasterizer(data);
        QRectF nr = r.normalized();
        if (!nr.isEmpty()) {
            const QPointF a = s->matrix.map((nr.topLeft() + nr.bottomLeft()) * 0.5f);
            const QPointF b = s->matrix.map((nr.topRight() + nr.bottomRight()) * 0.5f);
            d->rasterizer->rasterizeLine(a, b, nr.height() / nr.width());
        }
        return;
    }

    QPainterPath path;
    path.addRect(r);
    ensureOutlineMapper();
    fillPath(path, data);
}